

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O0

void __thiscall ExternalCodeEditor::close_editor(ExternalCodeEditor *this)

{
  int iVar1;
  pid_t pVar2;
  char *pcVar3;
  ExternalCodeEditor *this_local;
  
  if (G_debug != 0) {
    printf("close_editor() called: pid=%ld\n",(long)this->pid_);
  }
  while( true ) {
    while( true ) {
      iVar1 = is_editing(this);
      if (iVar1 == 0) {
        return;
      }
      pVar2 = reap_editor(this);
      if (pVar2 != -1) break;
      iVar1 = this->pid_;
      pcVar3 = filename(this);
      fl_alert("Error reaping external editor\npid=%ld file=%s",(long)iVar1,pcVar3);
    }
    if (pVar2 != 0) break;
    iVar1 = this->pid_;
    pcVar3 = filename(this);
    iVar1 = fl_choice("Please close external editor\npid=%ld file=%s","Force Close","Closed",
                      (char *)0x0,(long)iVar1,pcVar3);
    if (iVar1 == 0) {
      kill_editor(this);
    }
  }
  return;
}

Assistant:

void ExternalCodeEditor::close_editor() {
  if ( G_debug ) printf("close_editor() called: pid=%ld\n", long(pid_));
  // Wait until editor is closed + reaped
  while ( is_editing() ) {
    switch ( reap_editor() ) {
      case -1:  // error
        fl_alert("Error reaping external editor\n"
                 "pid=%ld file=%s", long(pid_), filename());
        break;
      case 0:   // process still running
	switch ( fl_choice("Please close external editor\npid=%ld file=%s",
			   "Force Close",	// button 0
			   "Closed",		// button 1
			   0,			// button 2
			   long(pid_), filename() ) ) {
	  case 0: 	// Force Close
	    kill_editor();
	    continue;
	  case 1: 	// Closed? try to reap
	    continue;
	}
        break;
      default:  // process reaped
        return;
    }
  }
}